

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

int cppcms_capi_session_init(cppcms_capi_session *session,cppcms_capi_session_pool *pool)

{
  session_pool *pool_00;
  session_interface *this;
  logic_error *this_00;
  
  if (session == (cppcms_capi_session *)0x0) {
    return -1;
  }
  if (pool == (cppcms_capi_session_pool *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"pool is NULL");
  }
  else {
    pool_00 = (pool->p).ptr_;
    if (pool_00 != (session_pool *)0x0) {
      this = (session_interface *)operator_new(0xc0);
      cppcms::session_interface::session_interface
                (this,pool_00,&(session->adapter).super_session_interface_cookie_adapter);
      booster::hold_ptr<cppcms::session_interface>::reset(&session->p,this);
      return 0;
    }
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Session pool is not initialized");
  }
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int cppcms_capi_session_init(cppcms_capi_session *session,cppcms_capi_session_pool *pool)
{
	TRY {
		if(!session)
			return -1;
		if(!pool)
			throw std::logic_error("pool is NULL");
		if(!pool->p.get()) {
			throw std::logic_error("Session pool is not initialized");
		}
		session->p.reset(new cppcms::session_interface(*pool->p,session->adapter));
	}